

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void sync(void)

{
  char cVar1;
  bool bVar2;
  char *in_RDI;
  char *pcVar3;
  
  bVar2 = false;
LAB_00105304:
  do {
    pcVar3 = in_RDI;
    if (bVar2) {
      return;
    }
    while( true ) {
      cVar1 = *pcVar3;
      bVar2 = cVar1 != '\0';
      if (cVar1 == '\0') break;
      if ((t->id == -1) || (t->id == (int)cVar1)) goto LAB_00105304;
      pcVar3 = pcVar3 + 1;
    }
    next();
  } while( true );
}

Assistant:

int sync(const char* accepted)
{
    int loop = 1;
    const char* p;
#ifndef NDEBUG
    printf("Trying to resync with one of : ");
    p = accepted;
    while (*p)
    {
        printf("'%c'", *p);
        ++p;
        if (*p)
            printf(", ");
    }
    printf("\n\tLast token : %s\n\tCurrent : %s\n", token_name(last_id), token_name(t->id));
#endif
    while (loop)
    {
        p = accepted;
        while (*p && t->id != EOF && *p != t->id)
            ++p;

        if (*p)
            loop = 0;
        else
            next();
    }
#ifndef NDEBUG
    printf("\tResult: %s found at %d:%d\n", token_name(t->id), t->line, t->column);
#endif
    return *p == t->id;
}